

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>const&>
::
UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>*,std::vector<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>,std::allocator<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>>>>>
          (UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>const&>
           *this,Flags matcher_flags,
          __normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>_>
          first,__normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>_>
                last)

{
  long lVar1;
  vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
  *__range3;
  Matcher<const_phmap::priv::hash_internal::EnumClass_&> *m;
  long lVar2;
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> local_48;
  
  *(Flags *)(this + 8) = matcher_flags;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined ***)this = &PTR__UnorderedElementsAreMatcherImpl_002226f0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    Matcher<const_phmap::priv::hash_internal::EnumClass_&>::Matcher
              ((Matcher<const_phmap::priv::hash_internal::EnumClass_&> *)&local_48,first._M_current)
    ;
    std::
    vector<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>,std::allocator<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>>>
    ::emplace_back<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>>
              ((vector<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>,std::allocator<testing::Matcher<phmap::priv::hash_internal::EnumClass_const&>>>
                *)(this + 0x28),(Matcher<const_phmap::priv::hash_internal::EnumClass_&> *)&local_48)
    ;
    MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::~MatcherBase(&local_48);
  }
  lVar1 = *(long *)(this + 0x30);
  for (lVar2 = *(long *)(this + 0x28); lVar2 != lVar1; lVar2 = lVar2 + 0x18) {
    if (*(long *)(lVar2 + 8) == 0) {
      local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
    }
    else {
      local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)(**(code **)(*(long *)(lVar2 + 8) + 0x10))(lVar2);
    }
    std::
    vector<testing::MatcherDescriberInterface_const*,std::allocator<testing::MatcherDescriberInterface_const*>>
    ::emplace_back<testing::MatcherDescriberInterface_const*>
              ((vector<testing::MatcherDescriberInterface_const*,std::allocator<testing::MatcherDescriberInterface_const*>>
                *)(this + 0x10),(MatcherDescriberInterface **)&local_48);
  }
  return;
}

Assistant:

UnorderedElementsAreMatcherImpl(UnorderedMatcherRequire::Flags matcher_flags,
                                  InputIter first, InputIter last)
      : UnorderedElementsAreMatcherImplBase(matcher_flags) {
    for (; first != last; ++first) {
      matchers_.push_back(MatcherCast<const Element&>(*first));
    }
    for (const auto& m : matchers_) {
      matcher_describers().push_back(m.GetDescriber());
    }
  }